

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  int *ip;
  BYTE *pInLimit;
  int iVar1;
  seqStore_t *seqStorePtr;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  int *piVar9;
  int *ip_00;
  int *piVar10;
  uint local_90;
  uint local_8c;
  size_t local_88;
  size_t offsetFound;
  int *local_70;
  ZSTD_matchState_t *local_68;
  ZSTD_compressionParameters *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint *local_48;
  BYTE *local_40;
  seqStore_t *local_38;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  local_40 = (ms->window).base + (ms->window).dictLimit;
  local_4c = *rep;
  local_50 = rep[1];
  ip_00 = (int *)((ulong)(local_40 == (BYTE *)src) + (long)src);
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_54 = (int)ip_00 - (int)local_40;
  local_8c = local_50;
  if (local_54 < local_50) {
    local_8c = 0;
  }
  uVar6 = (ulong)local_4c;
  if (local_54 < local_4c) {
    uVar6 = 0;
  }
  local_70 = (int *)((long)src + (srcSize - 8));
  local_68 = ms;
  local_60 = cParams;
  local_38 = seqStore;
  do {
    local_90 = (uint)uVar6;
    lVar8 = -uVar6;
    while( true ) {
      if (local_70 <= ip_00) {
        uVar2 = 0;
        if (local_54 < local_50) {
          uVar2 = local_50;
        }
        if (local_54 < local_4c) {
          uVar2 = local_4c;
        }
        if (local_90 == 0) {
          local_90 = uVar2;
        }
        if (local_8c != 0) {
          uVar2 = local_8c;
        }
        *rep = local_90;
        rep[1] = uVar2;
        return (long)pInLimit - (long)src;
      }
      if (local_90 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        if (*(int *)((long)ip_00 + 1) == *(int *)((long)ip_00 + lVar8 + 1)) {
          sVar3 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar8 + 5),pInLimit);
          uVar6 = sVar3 + 4;
        }
      }
      offsetFound = 99999999;
      sVar3 = ZSTD_BtFindBestMatch_selectMLS(local_68,local_60,(BYTE *)ip_00,pInLimit,&offsetFound);
      uVar4 = uVar6;
      if (uVar6 < sVar3) {
        uVar4 = sVar3;
      }
      if (3 < uVar4) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    sVar7 = offsetFound;
    if (sVar3 <= uVar6) {
      sVar7 = 0;
    }
    ip = (int *)((long)ip_00 + 1);
    local_48 = rep;
    if (uVar6 < sVar3) {
      ip = ip_00;
    }
LAB_0018b58b:
    do {
      piVar10 = ip_00;
      piVar9 = ip;
      local_88 = sVar7;
      sVar3 = uVar4;
      if (local_70 <= piVar10) break;
      ip = (int *)((long)piVar10 + 1);
      if (local_88 == 0) {
        local_88 = 0;
      }
      else if ((local_90 != 0) && (*ip == *(int *)((long)ip + lVar8))) {
        sVar7 = ZSTD_count((BYTE *)((long)piVar10 + 5),(BYTE *)((long)piVar10 + lVar8 + 5),pInLimit)
        ;
        if (sVar7 < 0xfffffffffffffffc) {
          uVar5 = (int)local_88 + 1;
          uVar2 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          if ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
            local_88 = 0;
            sVar3 = sVar7 + 4;
            piVar9 = ip;
          }
        }
      }
      offsetFound = 99999999;
      uVar4 = ZSTD_BtFindBestMatch_selectMLS(local_68,local_60,(BYTE *)ip,pInLimit,&offsetFound);
      if (3 < uVar4) {
        uVar5 = (int)local_88 + 1;
        uVar2 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar5 = (int)offsetFound + 1;
        iVar1 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        sVar7 = offsetFound;
        ip_00 = ip;
        if ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 4 + -0x1b) < (int)uVar4 * 4 - iVar1)
        goto LAB_0018b58b;
      }
      if (local_70 <= ip) break;
      ip = (int *)((long)piVar10 + 2);
      if (local_88 == 0) {
        local_88 = 0;
      }
      else if ((local_90 != 0) && (*ip == *(int *)((long)ip + lVar8))) {
        sVar7 = ZSTD_count((BYTE *)((long)piVar10 + 6),(BYTE *)((long)piVar10 + lVar8 + 6),pInLimit)
        ;
        if (sVar7 < 0xfffffffffffffffc) {
          uVar5 = (int)local_88 + 1;
          uVar2 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          if ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
            local_88 = 0;
            sVar3 = sVar7 + 4;
            piVar9 = ip;
          }
        }
      }
      offsetFound = 99999999;
      uVar4 = ZSTD_BtFindBestMatch_selectMLS(local_68,local_60,(BYTE *)ip,pInLimit,&offsetFound);
      if (uVar4 < 4) break;
      uVar5 = (int)local_88 + 1;
      uVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar5 = (int)offsetFound + 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = offsetFound;
      ip_00 = ip;
    } while ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 4 + -0x18) < (int)uVar4 * 4 - iVar1);
    seqStorePtr = local_38;
    if (local_88 == 0) {
      local_88 = 0;
    }
    else {
      for (; ((src < piVar9 && (local_40 < (BYTE *)((long)piVar9 + (2 - local_88)))) &&
             (*(BYTE *)((long)piVar9 + -1) == *(BYTE *)((long)piVar9 + (1 - local_88))));
          piVar9 = (int *)((long)piVar9 + -1)) {
        sVar3 = sVar3 + 1;
      }
      local_8c = local_90;
      local_90 = (int)local_88 - 2;
    }
    ZSTD_storeSeq(local_38,(long)piVar9 - (long)src,src,(U32)local_88,sVar3 - 3);
    rep = local_48;
    uVar2 = local_8c;
    for (src = (void *)((long)piVar9 + sVar3);
        ((local_8c = uVar2, uVar6 = (ulong)local_90, ip_00 = (int *)src, local_8c != 0 &&
         (src <= local_70)) && (*src == *(int *)((long)src - (ulong)local_8c)));
        src = (void *)((long)src + sVar3 + 4)) {
      sVar3 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_8c)),
                         pInLimit);
      ZSTD_storeSeq(seqStorePtr,0,src,0,sVar3 + 1);
      uVar2 = local_90;
      local_90 = local_8c;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 1, 2);
}